

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZShapeHDivKernel2D.cpp
# Opt level: O2

void TPZShapeHDivKernel2D<pzshape::TPZShapeLinear>::Shape
               (TPZVec<double> *pt,TPZShapeData *data,TPZFMatrix<double> *phi,
               TPZFMatrix<double> *divphi)

{
  double dVar1;
  int iVar2;
  double *pdVar3;
  ulong col;
  ulong uVar4;
  
  TPZShapeH1<pzshape::TPZShapeLinear>::Shape(pt,data);
  (*(divphi->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0xf])
            (divphi);
  uVar4 = (data->fPhi).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow;
  iVar2 = (int)uVar4;
  (*(phi->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0xd])
            (phi,2,(long)iVar2);
  col = 0;
  uVar4 = uVar4 & 0xffffffff;
  if (iVar2 < 1) {
    uVar4 = col;
  }
  for (; uVar4 != col; col = col + 1) {
    pdVar3 = TPZFMatrix<double>::operator()(&(data->fDPhi).super_TPZFMatrix<double>,0,col);
    dVar1 = *pdVar3;
    pdVar3 = TPZFMatrix<double>::operator()(phi,0,col);
    *pdVar3 = dVar1;
  }
  return;
}

Assistant:

void TPZShapeHDivKernel2D<TSHAPE>::Shape(TPZVec<REAL> &pt, TPZShapeData &data, TPZFMatrix<REAL> &phi, TPZFMatrix<REAL> &divphi)
{

    const int dim = TSHAPE::Dimension;
    TPZShapeH1<TSHAPE>::Shape(pt,data);
    divphi.Zero();

    int nshape = data.fPhi.Rows();
    phi.Resize(2,nshape);

    switch (dim)
    {
    case 1:
        for (int i = 0; i < nshape; i++){
            phi(0,i) = data.fDPhi(0,i);
        }
        break;
    
    case 2:
        for (int i = 0; i < nshape; i++){
            phi(0,i) =  data.fDPhi(1,i);
            phi(1,i) = -data.fDPhi(0,i);
        }
        break;
    
    default:
        DebugStop();
        break;
    }


}